

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O3

bool launch(QString *launcher,QUrl *url,QString *xdgActivationToken)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  int *piVar4;
  char cVar5;
  QLoggingCategory *pQVar6;
  iterator iVar7;
  QString *pQVar8;
  bool bVar9;
  long in_FS_OFFSET;
  QStringView QVar10;
  QProcessEnvironment env;
  value_type v;
  QArrayDataPointer<QString> local_c8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  QArrayDataPointer<QString> local_98;
  QString local_78;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QLatin1String> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d._0_4_ = 0xaaaaaaaa;
  local_78.d.d._4_4_ = 0xaaaaaaaa;
  local_78.d.ptr._0_4_ = 0xaaaaaaaa;
  local_78.d.ptr._4_4_ = 0xaaaaaaaa;
  QUrl::toEncoded(&local_98,url,0x1f00000);
  local_58.a.b = L' ';
  local_58.b.m_size._0_4_ = (undefined4)local_98.size;
  local_58.b.m_size._4_4_ = (undefined4)((ulong)local_98.size >> 0x20);
  local_58.b.m_data = (char *)local_98.ptr;
  local_58.a.a = launcher;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QLatin1String>::convertTo<QString>
            (&local_78,&local_58);
  if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d)->super_QArrayData,1,0x10);
    }
  }
  pQVar6 = QtPrivateLogging::lcQpaServices();
  if (((pQVar6->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_58.b.m_data = pQVar6->name;
    local_58.a.a._0_4_ = 2;
    local_58.a.a._4_4_ = 0;
    local_58.a.b = L'\0';
    local_58.a._10_2_ = 0;
    local_58.a._12_4_ = 0;
    local_58.b.m_size._0_4_ = 0;
    local_58.b.m_size._4_4_ = 0;
    QString::toLocal8Bit_helper
              ((QChar *)&local_98,CONCAT44(local_78.d.ptr._4_4_,local_78.d.ptr._0_4_));
    if (local_98.ptr == (QString *)0x0) {
      local_98.ptr = (QString *)&QByteArray::_empty;
    }
    QMessageLogger::debug((char *)&local_58,"Launching %s",local_98.ptr);
    local_58.a.a = (QString *)CONCAT44(local_58.a.a._4_4_,local_58.a.a._0_4_);
    if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      local_58.a.a = (QString *)CONCAT44(local_58.a.a._4_4_,local_58.a.a._0_4_);
      if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d)->super_QArrayData,1,0x10);
      }
    }
  }
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QVar10.m_data = (storage_type_conflict *)local_78.d.size;
  QVar10.m_size = (qsizetype)&local_98;
  QProcess::splitCommand(QVar10);
  if ((undefined1 *)local_98.size != (undefined1 *)0x0) {
    iVar7 = QList<QString>::begin((QList<QString> *)&local_98);
    pDVar2 = ((iVar7.i)->d).d;
    pcVar3 = ((iVar7.i)->d).ptr;
    ((iVar7.i)->d).d = (Data *)0x0;
    ((iVar7.i)->d).ptr = (char16_t *)0x0;
    local_58.a.a._0_4_ = SUB84(pDVar2,0);
    local_58.a.a._4_4_ = (undefined4)((ulong)pDVar2 >> 0x20);
    local_58.a.b = (char16_t)pcVar3;
    local_58.a._10_2_ = SUB82((ulong)pcVar3 >> 0x10,0);
    local_58.a._12_4_ = SUB84((ulong)pcVar3 >> 0x20,0);
    qVar1 = ((iVar7.i)->d).size;
    ((iVar7.i)->d).size = 0;
    local_58.b.m_size._0_4_ = (undefined4)qVar1;
    local_58.b.m_size._4_4_ = (undefined4)((ulong)qVar1 >> 0x20);
    QtPrivate::QGenericArrayOps<QString>::eraseFirst((QGenericArrayOps<QString> *)&local_98);
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
    QProcess::QProcess((QProcess *)&local_a8,(QObject *)0x0);
    QProcess::setProgram((QString *)&local_a8);
    QProcess::setArguments((QList_conflict *)&local_a8);
    if ((xdgActivationToken->d).size != 0) {
      local_b0 = &DAT_aaaaaaaaaaaaaaaa;
      QProcessEnvironment::systemEnvironment();
      local_c8.d = (Data *)0x0;
      local_c8.ptr = (QString *)0x6c7bf2;
      local_c8.size = 0x14;
      QProcessEnvironment::insert((QString *)&local_b0,(QString *)&local_c8);
      if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c8.d)->super_QArrayData,2,0x10);
        }
      }
      QProcessEnvironment::toStringList();
      QProcess::setEnvironment((QList_conflict *)&local_a8);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_c8);
      QProcessEnvironment::~QProcessEnvironment((QProcessEnvironment *)&local_b0);
    }
    cVar5 = QProcess::startDetached((longlong *)&local_a8);
    QProcess::~QProcess((QProcess *)&local_a8);
    piVar4 = (int *)CONCAT44(local_58.a.a._4_4_,local_58.a.a._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_58.a.a._4_4_,local_58.a.a._0_4_),2,0x10)
        ;
      }
    }
    bVar9 = true;
    if (cVar5 != '\0') goto LAB_00624dd6;
  }
  pQVar6 = QtPrivateLogging::lcQpaServices();
  if (((pQVar6->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
    local_58.b.m_data = pQVar6->name;
    local_58.a.a._0_4_ = 2;
    local_58.a.a._4_4_ = 0;
    local_58.a.b = L'\0';
    local_58.a._10_2_ = 0;
    local_58.a._12_4_ = 0;
    local_58.b.m_size._0_4_ = 0;
    local_58.b.m_size._4_4_ = 0;
    QString::toLocal8Bit_helper
              ((QChar *)&local_c8,CONCAT44(local_78.d.ptr._4_4_,local_78.d.ptr._0_4_));
    pQVar8 = local_c8.ptr;
    if (local_c8.ptr == (QString *)0x0) {
      pQVar8 = (QString *)&QByteArray::_empty;
    }
    QMessageLogger::warning((char *)&local_58,"Launch failed (%s)",pQVar8);
    local_58.a.a = (QString *)CONCAT44(local_58.a.a._4_4_,local_58.a.a._0_4_);
    if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      local_58.a.a = (QString *)CONCAT44(local_58.a.a._4_4_,local_58.a.a._0_4_);
      if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.d)->super_QArrayData,1,0x10);
      }
    }
  }
  bVar9 = false;
LAB_00624dd6:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  piVar4 = (int *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_),2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar9;
  }
  __stack_chk_fail();
}

Assistant:

static inline bool launch(const QString &launcher, const QUrl &url,
                          const QString &xdgActivationToken)
{

    const QString command = launcher + u' ' + QLatin1StringView(url.toEncoded());
    qCDebug(lcQpaServices, "Launching %s", qPrintable(command));
#if !QT_CONFIG(process)
    if (!xdgActivationToken.isEmpty())
        qputenv("XDG_ACTIVATION_TOKEN", xdgActivationToken.toUtf8());
    const bool ok = ::system(qPrintable(command + " &"_L1));
    if (!xdgActivationToken.isEmpty())
        qunsetenv("XDG_ACTIVATION_TOKEN");
#  else
    QStringList args = QProcess::splitCommand(command);
    bool ok = false;
    if (!args.isEmpty()) {
        QString program = args.takeFirst();
        QProcess process;
        process.setProgram(program);
        process.setArguments(args);

        if (!xdgActivationToken.isEmpty()) {
            auto env = QProcessEnvironment::systemEnvironment();
            env.insert(u"XDG_ACTIVATION_TOKEN"_s, xdgActivationToken);
            process.setEnvironment(env.toStringList());
        }
        ok = process.startDetached(nullptr);
    }
#  endif
    if (!ok)
        qCWarning(lcQpaServices, "Launch failed (%s)", qPrintable(command));

    return ok;
}